

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-loop-count.c
# Opt level: O2

int run_benchmark_loop_alive(void)

{
  int iVar1;
  uv_loop_t *loop;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int64_t eval_b;
  int64_t eval_a;
  int ticks;
  
  loop = uv_default_loop();
  ticks = 0;
  uv_idle_init(loop,&idle_handle);
  idle_handle.data = &ticks;
  uv_idle_start(&idle_handle,idle_alive_cb);
  uVar2 = uv_hrtime();
  uv_run(loop,UV_RUN_DEFAULT);
  uVar3 = uv_hrtime();
  eval_a = (int64_t)ticks;
  eval_b = 200000000;
  if (eval_a == 200000000) {
    lVar4 = uVar3 - uVar2;
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000000.0;
    fprintf(_stderr,"loop_alive: %d ticks in %.2fs (%.0f/s)\n",dVar8,200000000.0 / dVar8,200000000);
    fflush(_stderr);
    close_loop(loop);
    eval_a = 0;
    iVar1 = uv_loop_close(loop);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar7 = "uv_loop_close(loop)";
    pcVar6 = "0";
    uVar5 = 0x84;
  }
  else {
    pcVar7 = "(2 * 1000 * 1000 * 100)";
    pcVar6 = "ticks";
    uVar5 = 0x7c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/benchmark-loop-count.c"
          ,uVar5,pcVar6,"==",pcVar7,eval_a,"==",eval_b);
  abort();
}

Assistant:

BENCHMARK_IMPL(loop_alive) {
  uv_loop_t* loop = uv_default_loop();
  int ticks = 0;
  uint64_t ns;

  uv_idle_init(loop, &idle_handle);
  idle_handle.data = &ticks;
  uv_idle_start(&idle_handle, idle_alive_cb);

  ns = uv_hrtime();
  uv_run(loop, UV_RUN_DEFAULT);
  ns = uv_hrtime() - ns;

  ASSERT_EQ(ticks, NUM_TICKS2);

  fprintf(stderr, "loop_alive: %d ticks in %.2fs (%.0f/s)\n",
          NUM_TICKS2,
          ns / 1e9,
          NUM_TICKS2 / (ns / 1e9));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}